

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.h
# Opt level: O3

bool google::protobuf::internal::ValidateEnum(int value,uint32_t *data)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar5 = (ulong)(*data >> 0x10);
  uVar3 = (long)value - (long)(short)*data;
  bVar6 = true;
  uVar4 = uVar3 - uVar5;
  if (uVar5 <= uVar3) {
    uVar1 = data[1];
    if (uVar4 < (uVar1 & 0xffff)) {
      return (data[(uVar4 >> 5) + 2] >> ((uint)uVar4 & 0x1f) & 1) != 0;
    }
    uVar3 = 0;
    do {
      bVar6 = uVar3 < uVar1 >> 0x10;
      if (!bVar6) {
        return bVar6;
      }
      iVar2 = *(int *)((long)data + uVar3 * 4 + (ulong)(uVar1 >> 3 & 0x1ffc) + 8);
      uVar3 = (uVar3 * 2 - (ulong)(value < iVar2)) + 2;
    } while (iVar2 != value);
  }
  return bVar6;
}

Assistant:

inline PROTOBUF_ALWAYS_INLINE bool ValidateEnumInlined(int value,
                                                       const uint32_t* data) {
  const int16_t min_seq = static_cast<int16_t>(data[0] & 0xFFFF);
  const uint16_t length_seq = static_cast<uint16_t>(data[0] >> 16);
  uint64_t adjusted =
      static_cast<uint64_t>(static_cast<int64_t>(value)) - min_seq;
  // Check if the value is within the sequential part.
  if (PROTOBUF_PREDICT_TRUE(adjusted < length_seq)) {
    return true;
  }

  const uint16_t length_bitmap = static_cast<uint16_t>(data[1] & 0xFFFF);
  adjusted -= length_seq;
  // Check if the value is within the bitmap.
  if (PROTOBUF_PREDICT_TRUE(adjusted < length_bitmap)) {
    return ((data[2 + (adjusted / 32)] >> (adjusted % 32)) & 1) == 1;
  }

  // Check if the value is on the ordered part.
  const uint16_t num_ordered = static_cast<uint16_t>(data[1] >> 16);
  data += 2 + length_bitmap / 32;
  size_t pos = 0;
  while (pos < num_ordered) {
    const int32_t sample = static_cast<int32_t>(data[pos]);
    if (sample == value) return true;
    pos = 2 * pos + (sample > value ? 1 : 2);
  }
  return false;
}